

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O1

QAM * __thiscall QAM::notag(QAM *__return_storage_ptr__,QAM *this)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = (this->qam)._M_elems[1];
  iVar3 = (this->qam)._M_elems[2];
  iVar4 = (this->qam)._M_elems[3];
  (__return_storage_ptr__->qam)._M_elems[0] = (this->qam)._M_elems[0];
  (__return_storage_ptr__->qam)._M_elems[1] = iVar2;
  (__return_storage_ptr__->qam)._M_elems[2] = iVar3;
  (__return_storage_ptr__->qam)._M_elems[3] = iVar4;
  (__return_storage_ptr__->tag)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->tag).field_2;
  pcVar1 = (this->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->tag,pcVar1,pcVar1 + (this->tag)._M_string_length);
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->tag,0,
             (char *)(__return_storage_ptr__->tag)._M_string_length,0x14b86c);
  return __return_storage_ptr__;
}

Assistant:

QAM notag(void) const
    {
        QAM q(*this);
        q.tag = "";
        return q;
    }